

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::Square(Bignum *this)

{
  int iVar1;
  uint uVar2;
  int size;
  uint *puVar3;
  Chunk chunk2_1;
  Chunk chunk1_1;
  int bigit_index2_1;
  int bigit_index1_1;
  int i_2;
  Chunk chunk2;
  Chunk chunk1;
  int bigit_index2;
  int bigit_index1;
  int i_1;
  int i;
  int copy_offset;
  DoubleChunk accumulator;
  int product_length;
  Bignum *this_local;
  
  size = this->used_digits_ << 1;
  EnsureCapacity(this,size);
  if (0xff < this->used_digits_) {
    abort();
  }
  _i = 0;
  iVar1 = this->used_digits_;
  for (bigit_index1 = 0; bigit_index1 < this->used_digits_; bigit_index1 = bigit_index1 + 1) {
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,bigit_index1);
    uVar2 = *puVar3;
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,iVar1 + bigit_index1);
    *puVar3 = uVar2;
  }
  for (bigit_index2 = 0; bigit_index2 < this->used_digits_; bigit_index2 = bigit_index2 + 1) {
    chunk2 = 0;
    for (chunk1 = bigit_index2; -1 < (int)chunk1; chunk1 = chunk1 - 1) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,iVar1 + chunk1);
      uVar2 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,iVar1 + chunk2);
      _i = (ulong)uVar2 * (ulong)*puVar3 + _i;
      chunk2 = chunk2 + 1;
    }
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,bigit_index2);
    *puVar3 = (uint)_i & 0xfffffff;
    _i = _i >> 0x1c;
  }
  for (bigit_index2_1 = this->used_digits_; bigit_index2_1 < size;
      bigit_index2_1 = bigit_index2_1 + 1) {
    chunk1_1 = this->used_digits_ - 1;
    for (chunk2_1 = bigit_index2_1 - chunk1_1; (int)chunk2_1 < this->used_digits_;
        chunk2_1 = chunk2_1 + 1) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,iVar1 + chunk1_1);
      uVar2 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,iVar1 + chunk2_1);
      _i = (ulong)uVar2 * (ulong)*puVar3 + _i;
      chunk1_1 = chunk1_1 - 1;
    }
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,bigit_index2_1);
    *puVar3 = (uint)_i & 0xfffffff;
    _i = _i >> 0x1c;
  }
  this->used_digits_ = size;
  this->exponent_ = this->exponent_ << 1;
  Clamp(this);
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}